

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::extraValidConversions<units::unit,units::unit>
                 (double val,unit *start,unit *result)

{
  bool bVar1;
  unit *in_RSI;
  unit *in_RDI;
  double in_XMM0_Qa;
  double __x;
  double dVar2;
  double dVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  unit *in_stack_ffffffffffffff78;
  unit *in_stack_ffffffffffffff80;
  bool local_59;
  bool local_31;
  double local_8;
  
  unit::pow((unit *)&units::m,in_XMM0_Qa,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  bVar1 = unit::has_same_base(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_31 = false;
  if (bVar1) {
    local_31 = unit::has_same_base(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  if (local_31 == false) {
    bVar1 = unit::has_same_base(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_59 = false;
    if (bVar1) {
      unit::pow((unit *)&units::m,__x,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
      local_59 = unit::has_same_base(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    if (local_59 == false) {
      local_8 = NAN;
    }
    else {
      dVar2 = unit::multiplier(in_RDI);
      dVar3 = precise_unit::multiplier((precise_unit *)precise::energy::scm);
      local_8 = unit::multiplier(in_RSI);
      local_8 = ((in_XMM0_Qa * dVar2) / dVar3) / local_8;
    }
  }
  else {
    dVar2 = unit::multiplier(in_RDI);
    dVar3 = precise_unit::multiplier((precise_unit *)precise::energy::scm);
    local_8 = unit::multiplier(in_RSI);
    local_8 = (in_XMM0_Qa * dVar2 * dVar3) / local_8;
  }
  return local_8;
}

Assistant:

inline double
        extraValidConversions(double val, const UX& start, const UX2& result)
    {
        if (start.has_same_base(m.pow(3)) && result.has_same_base(J)) {
            // volume to scf or scm
            return val * start.multiplier() *
                precise::energy::scm.multiplier() / result.multiplier();
        }
        if (start.has_same_base(J) && result.has_same_base(m.pow(3))) {
            // volume to scf or scm
            return val * start.multiplier() /
                precise::energy::scm.multiplier() / result.multiplier();
        }
        return constants::invalid_conversion;
    }